

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall
ObserverManager_TwoProtocolsSubscribe_Test::~ObserverManager_TwoProtocolsSubscribe_Test
          (ObserverManager_TwoProtocolsSubscribe_Test *this)

{
  ObserverManager_TwoProtocolsSubscribe_Test *this_local;
  
  ~ObserverManager_TwoProtocolsSubscribe_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsSubscribe) {
    std::stringstream out;

    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    delete b;

    EXPECT_EQ("Tic Tac Toe ", out.str());
}